

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

int __thiscall PFData::emplaceSubgridFromFile(PFData *this,FILE *fp,int gridZ,int gridY,int gridX)

{
  int iVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  double dVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  size_t __n;
  long lVar14;
  int iVar15;
  
  lVar6 = getSubgridOffset(this,gridZ,gridY,gridX);
  fseek((FILE *)fp,lVar6 + 0x24,0);
  iVar10 = this->m_ny;
  iVar13 = this->m_p;
  iVar12 = (uint)(gridZ < this->m_nz % this->m_r) + this->m_nz / this->m_r;
  iVar1 = this->m_nx;
  iVar15 = (uint)(gridY < iVar10 % this->m_q) + iVar10 / iVar13;
  iVar3 = getSubgridStartZ(this,gridZ);
  iVar4 = getSubgridStartY(this,gridY);
  iVar5 = getSubgridStartX(this,gridX);
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  lVar6 = (long)((iVar3 * iVar10 + iVar4) * iVar1 + iVar5);
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  __n = (size_t)(int)((uint)(gridX < iVar1 % iVar13) + iVar1 / iVar13);
  iVar10 = 0;
  do {
    if (iVar10 == iVar12) {
      return 0;
    }
    for (iVar13 = 0; iVar13 != iVar15; iVar13 = iVar13 + 1) {
      lVar11 = (long)(this->m_nx * iVar10 * this->m_ny);
      lVar14 = (long)(this->m_nx * iVar13);
      pdVar2 = this->m_data;
      sVar7 = fread(pdVar2 + lVar6 + lVar11 + lVar14,8,__n,(FILE *)fp);
      if (sVar7 != __n) {
        piVar9 = __errno_location();
        return *piVar9;
      }
      for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
        dVar8 = (double)bswap64((uint64_t)pdVar2[lVar6 + lVar14 + lVar11 + sVar7]);
        pdVar2[lVar6 + lVar14 + lVar11 + sVar7] = dVar8;
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

int PFData::emplaceSubgridFromFile(std::FILE* fp, int gridZ, int gridY, int gridX){
    //Position file
    const long offset = getSubgridOffset(gridZ, gridY, gridX) + 36;
    std::fseek(fp, offset, SEEK_SET);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const int startZ = getSubgridStartZ(gridZ);
    const int startY = getSubgridStartY(gridY);
    const int startX = getSubgridStartX(gridX);

    //The index into m_data where the first element of the grid belongs.
    const long long startOfGrid = startZ*m_nx*m_ny + startY * m_nx + startX;

    for(int z = 0; z < sizeZ; ++z){
        for(int y = 0; y < sizeY; ++y){
            const long long index = startOfGrid + z * m_nx * m_ny + y * m_nx;
            double* const dataPtr = &(m_data[index]);

            const std::size_t numRead = std::fread(dataPtr, 8, sizeX, fp);
            if(numRead != static_cast<std::size_t>(sizeX)){
                return errno;
            }

            //Perform endian byte swap
            for(std::size_t i = 0; i < sizeX; ++i){
                uint64_t tmp = *reinterpret_cast<uint64_t*>(&dataPtr[i]);
                tmp = bswap64(tmp);
                dataPtr[i] = *reinterpret_cast<double*>(&tmp);
            }
        }
    }

    return 0;
}